

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# debug.h
# Opt level: O1

void kj::_::Debug::
     log<char_const(&)[69],kj::_::DebugComparison<char_const(&)[4],capnp::Text::Reader>&,char_const(&)[4],capnp::Text::Reader>
               (char *file,int line,LogSeverity severity,char *macroArgs,char (*params) [69],
               DebugComparison<const_char_(&)[4],_capnp::Text::Reader> *params_1,
               char (*params_2) [4],Reader *params_3)

{
  long lVar1;
  undefined8 uVar2;
  undefined8 *puVar3;
  ArrayPtr<kj::String> argValues_00;
  undefined4 in_register_00000014;
  char (*params_00) [4];
  Reader *params_01;
  long lVar4;
  String argValues [4];
  String *in_stack_ffffffffffffff48;
  size_t in_stack_ffffffffffffff50;
  String local_98 [2];
  String local_68;
  String local_50;
  
  str<char_const(&)[69]>
            (local_98,(kj *)params,(char (*) [69])CONCAT44(in_register_00000014,severity));
  _::operator*(&stack0xffffffffffffff48,params_1);
  str<char_const(&)[4]>(&local_68,(kj *)params_2,params_00);
  str<capnp::Text::Reader&>(&local_50,(kj *)params_3,params_01);
  argValues_00.size_ = in_stack_ffffffffffffff50;
  argValues_00.ptr = in_stack_ffffffffffffff48;
  logInternal((Debug *)file,(char *)(ulong)(uint)line,severity,(LogSeverity)macroArgs,
              (char *)local_98,argValues_00);
  lVar4 = 0x48;
  do {
    lVar1 = *(long *)((long)&local_98[0].content.ptr + lVar4);
    if (lVar1 != 0) {
      uVar2 = *(undefined8 *)((long)&local_98[0].content.size_ + lVar4);
      *(undefined8 *)((long)&local_98[0].content.ptr + lVar4) = 0;
      *(undefined8 *)((long)&local_98[0].content.size_ + lVar4) = 0;
      puVar3 = *(undefined8 **)((long)&local_98[0].content.disposer + lVar4);
      (**(code **)*puVar3)(puVar3,lVar1,1,uVar2,uVar2,0);
    }
    lVar4 = lVar4 + -0x18;
  } while (lVar4 != -0x18);
  return;
}

Assistant:

void Debug::log(const char* file, int line, LogSeverity severity, const char* macroArgs,
                Params&&... params) {
  String argValues[sizeof...(Params)] = {str(params)...};
  logInternal(file, line, severity, macroArgs, arrayPtr(argValues, sizeof...(Params)));
}